

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O2

tmbstr ParseValue(TidyDocImpl *doc,ctmbstr name,Bool foldCase,Bool *isempty,int *pdelim)

{
  Lexer *lexer;
  Lexer *lexer_00;
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint c;
  Bool BVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  tmbstr ptVar9;
  char *pcVar10;
  ulong uVar11;
  uint uVar12;
  StreamIn *in;
  long lVar13;
  ulong uVar14;
  ulong uStack_90;
  uint local_54;
  
  lexer = doc->lexer;
  *pdelim = 0x22;
  iVar7 = *(int *)((doc->config).value + 0x2c);
  do {
    uVar2 = prvTidyReadChar(doc->docIn);
    if (uVar2 == 0xffffffff) {
      prvTidyUngetChar(0xffffffff,doc->docIn);
      goto LAB_00147a07;
    }
  } while ((uVar2 < 0x80) && ((lexmap[uVar2] & 8) != 0));
  if ((uVar2 < 0x3e) && ((0x2000008400000000U >> ((ulong)uVar2 & 0x3f) & 1) != 0)) {
    do {
      uVar2 = prvTidyReadChar(doc->docIn);
      if (uVar2 == 0xffffffff) {
        prvTidyUngetChar(0xffffffff,doc->docIn);
        goto LAB_00147a2b;
      }
    } while ((uVar2 < 0x80) && ((lexmap[uVar2] & 8) != 0));
    if ((uVar2 != 0x22) && (uVar2 != 0x27)) {
      if (uVar2 == 0x3c) {
        uVar2 = lexer->lexsize;
        prvTidyAddCharToLexer(lexer,0x3c);
        lexer_00 = doc->lexer;
        uVar3 = prvTidyReadChar(doc->docIn);
        prvTidyAddCharToLexer(lexer_00,uVar3);
        iVar7 = 0x22;
        uVar12 = uVar3 - 0x25;
        while (uVar3 = prvTidyReadChar(doc->docIn), uVar3 != 0xffffffff) {
          if (uVar3 == 0x3e) {
            if ((uVar12 < 0x1c) && ((0xc000001U >> (uVar12 & 0x1f) & 1) != 0)) {
              prvTidyAddCharToLexer(lexer_00,0x3e);
            }
            else {
              prvTidyUngetChar(0x3e,doc->docIn);
            }
            break;
          }
          if ((((0x1b < uVar12) || ((0xc000001U >> (uVar12 & 0x1f) & 1) == 0)) && (uVar3 < 0x80)) &&
             ((lexmap[uVar3] & 8) != 0)) break;
          prvTidyAddCharToLexer(lexer_00,uVar3);
          if (uVar3 == 0x27) {
            do {
              uVar3 = prvTidyReadChar(doc->docIn);
              if (uVar3 == 0x3e) goto LAB_00147cea;
              if (uVar3 == 0xffffffff) goto LAB_00147cc3;
              prvTidyAddCharToLexer(lexer_00,uVar3);
            } while (uVar3 != 0x27);
          }
          else if (uVar3 == 0x22) {
            do {
              uVar3 = prvTidyReadChar(doc->docIn);
              if (uVar3 == 0x3e) goto LAB_00147cea;
              if (uVar3 == 0xffffffff) goto LAB_00147cc3;
              prvTidyAddCharToLexer(lexer_00,uVar3);
            } while (uVar3 != 0x22);
            iVar7 = 0x27;
          }
        }
LAB_00147d14:
        *pdelim = iVar7;
        uVar3 = lexer->lexsize - uVar2;
        lexer->lexsize = uVar2;
        if (0 < (int)uVar3) {
          ptVar9 = prvTidytmbstrndup(doc->allocator,lexer->lexbuf + (int)uVar2,uVar3);
          return ptVar9;
        }
        goto LAB_00147a15;
      }
LAB_00147a2b:
      prvTidyUngetChar(uVar2,doc->docIn);
      uVar2 = 0;
    }
    uVar3 = lexer->lexsize;
    lVar8 = (long)(int)uVar3;
    bVar1 = false;
    local_54 = 0;
    uVar14 = 0;
LAB_00147a5e:
    uVar4 = prvTidyReadChar(doc->docIn);
    if (uVar4 != 0xffffffff) {
      uStack_90 = (ulong)uVar4;
      if (uVar2 == 0) {
        if ((uVar4 == 0x22) || (uVar4 == 0x27)) {
          c = prvTidyReadChar(doc->docIn);
          if (c != 0x3e) {
            prvTidyUngetChar(c,doc->docIn);
            goto LAB_00147b04;
          }
          prvTidyAddCharToLexer(lexer,uVar4);
LAB_00147d5c:
          in = doc->docIn;
          uVar4 = 0x3e;
          goto LAB_00147d65;
        }
        if (uVar4 != 0x2f) {
          if (uVar4 != 0x3c) {
            if (uVar4 == 0x3e) goto LAB_00147d5c;
            goto LAB_00147b04;
          }
          prvTidyUngetChar(0x3c,doc->docIn);
          prvTidyUngetChar(0x3e,doc->docIn);
          prvTidyReportAttrError(doc,lexer->token,(AttVal *)0x0,0x289);
          goto LAB_00147d6b;
        }
        uVar4 = prvTidyReadChar(doc->docIn);
        if ((uVar4 == 0x3e) && (BVar5 = prvTidyIsUrl(doc,name), BVar5 == no)) {
          *isempty = yes;
          prvTidyUngetChar(0x3e,doc->docIn);
          goto LAB_00147d6b;
        }
        uVar12 = 0x2f;
LAB_00147bb6:
        prvTidyUngetChar(uVar4,doc->docIn);
        uStack_90 = (ulong)uVar12;
LAB_00147bc8:
        if ((lexmap[uStack_90] & 8) == 0) {
          if ((foldCase != no) && ((lexmap[uStack_90] & 0x40) != 0)) {
            uVar4 = prvTidyToLower((uint)uStack_90);
            uStack_90 = (ulong)uVar4;
          }
        }
        else {
          if (uVar2 == 0) goto LAB_00147d6b;
          if (iVar7 == 0) {
            if (((uint)uStack_90 == 10) && (BVar5 = prvTidyIsUrl(doc,name), BVar5 != no)) {
              prvTidyReportAttrError(doc,lexer->token,(AttVal *)0x0,0x266);
              uVar14 = 10;
              goto LAB_00147a5e;
            }
            if ((int)uVar14 == 0x20) {
              BVar5 = prvTidyIsUrl(doc,name);
              uVar14 = 0x20;
              if (BVar5 != no) {
                prvTidyReportAttrError(doc,lexer->token,(AttVal *)0x0,0x290);
                uVar14 = 0x20;
              }
              goto LAB_00147a5e;
            }
            uStack_90 = 0x20;
          }
        }
LAB_00147c09:
        prvTidyAddCharToLexer(lexer,(uint)uStack_90);
        uVar14 = uStack_90;
        goto LAB_00147a5e;
      }
      if (uVar4 == uVar2) goto LAB_00147d6b;
      if ((uVar4 < 0x3f) && ((0x5000000000000400U >> (uStack_90 & 0x3f) & 1) != 0)) {
        local_54 = local_54 + 1;
      }
      if (uVar4 == 0x3e) {
        bVar1 = true;
      }
LAB_00147b04:
      if (uVar4 == 0x5c) {
        uVar4 = prvTidyReadChar(doc->docIn);
        uVar12 = 0x5c;
        uStack_90 = 10;
        if (uVar4 != 10) goto LAB_00147bb6;
        goto LAB_00147bc8;
      }
      if (uVar4 != 0x26) {
        if (uVar4 < 0x80) goto LAB_00147bc8;
        goto LAB_00147c09;
      }
      uStack_90 = 0x26;
      prvTidyAddCharToLexer(lexer,0x26);
      ParseEntity(doc,IgnoreWhitespace);
      uVar12 = lexer->lexsize - 1;
      uVar14 = uStack_90;
      if (((iVar7 == 0) && (uVar14 = 0x26, lexer->lexsize != 0)) && (lexer->lexbuf[uVar12] == '\n'))
      {
        lexer->lexbuf[uVar12] = ' ';
      }
      goto LAB_00147a5e;
    }
    prvTidyReportAttrError(doc,lexer->token,(AttVal *)0x0,0x283);
    in = doc->docIn;
    uVar4 = 0xffffffff;
LAB_00147d65:
    prvTidyUngetChar(uVar4,in);
LAB_00147d6b:
    if ((((((iVar7 == 0) && (10 < local_54)) && (bVar1)) &&
         (BVar5 = prvTidyIsScript(doc,name), BVar5 == no)) &&
        ((BVar5 = prvTidyIsUrl(doc,name), BVar5 == no ||
         (iVar6 = prvTidytmbstrncmp(lexer->lexbuf + lVar8,"javascript:",0xb), iVar6 != 0)))) &&
       (iVar6 = prvTidytmbstrncmp(lexer->lexbuf + lVar8,"<xml ",5), iVar6 != 0)) {
      prvTidyReport(doc,(Node *)0x0,(Node *)0x0,0x27d);
    }
    uVar4 = lexer->lexsize - uVar3;
    lexer->lexsize = uVar3;
    if ((uVar2 == 0) && ((int)uVar4 < 1)) {
      ptVar9 = (tmbstr)0x0;
    }
    else {
      if (((iVar7 == 0) &&
          (((0 < (int)uVar4 && (iVar7 = prvTidytmbstrcasecmp(name,"alt"), iVar7 != 0)) &&
           (iVar7 = prvTidytmbstrcasecmp(name,"title"), iVar7 != 0)))) &&
         ((iVar7 = prvTidytmbstrcasecmp(name,"value"), iVar7 != 0 &&
          (iVar7 = prvTidytmbstrcasecmp(name,"prompt"), iVar7 != 0)))) {
        uVar14 = (ulong)uVar4;
        do {
          uVar11 = uVar14;
          lVar13 = (long)lexer->lexbuf[uVar11 + lVar8 + -1];
          if ((lVar13 < 0) || (uVar11 == 0)) break;
          uVar14 = uVar11 - 1;
        } while ((lexmap[lVar13] & 8) != 0);
        pcVar10 = lexer->lexbuf + lVar8;
        while( true ) {
          uVar4 = (uint)uVar11;
          if ((((long)*pcVar10 < 0) || ((lexmap[*pcVar10] & 8) == 0)) || ((int)uVar4 < 1)) break;
          uVar11 = (ulong)(uVar4 - 1);
          uVar3 = uVar3 + 1;
          pcVar10 = pcVar10 + 1;
        }
      }
      ptVar9 = prvTidytmbstrndup(doc->allocator,lexer->lexbuf + (int)uVar3,uVar4);
    }
    *pdelim = uVar2;
  }
  else {
LAB_00147a07:
    prvTidyUngetChar(uVar2,doc->docIn);
LAB_00147a15:
    ptVar9 = (tmbstr)0x0;
  }
  return ptVar9;
LAB_00147cea:
  prvTidyUngetChar(0x3e,doc->docIn);
  iVar7 = 0;
  prvTidyReportAttrError(doc,lexer_00->token,(AttVal *)0x0,0x289);
  goto LAB_00147d14;
LAB_00147cc3:
  iVar7 = 0;
  prvTidyReportAttrError(doc,lexer_00->token,(AttVal *)0x0,0x283);
  prvTidyUngetChar(0xffffffff,doc->docIn);
  goto LAB_00147d14;
}

Assistant:

static tmbstr ParseValue( TidyDocImpl* doc, ctmbstr name,
                          Bool foldCase, Bool *isempty, int *pdelim)
{
    Lexer* lexer = doc->lexer;
    int len = 0, start;
    Bool seen_gt = no;
    Bool munge = yes;
    uint c, lastc, delim, quotewarning;
    tmbstr value;

    delim = (tmbchar) 0;
    *pdelim = '"';

    /*
     Henry Zrepa reports that some folk are using the
     embed element with script attributes where newlines
     are significant and must be preserved
    */
    if ( cfgBool(doc, TidyLiteralAttribs) )
        munge = no;

 /* skip white space before the '=' */

    for (;;)
    {
        c = TY_(ReadChar)(doc->docIn);

        if (c == EndOfStream)
        {
            TY_(UngetChar)(c, doc->docIn);
            break;
        }

        if (!TY_(IsWhite)(c))
           break;
    }

/*
  c should be '=' if there is a value
  other legal possibilities are white
  space, '/' and '>'
*/

    if (c != '=' && c != '"' && c != '\'')
    {
        TY_(UngetChar)(c, doc->docIn);
        return NULL;
    }

 /* skip white space after '=' */

    for (;;)
    {
        c = TY_(ReadChar)(doc->docIn);

        if (c == EndOfStream)
        {
            TY_(UngetChar)(c, doc->docIn);
            break;
        }

        if (!TY_(IsWhite)(c))
           break;
    }

 /* check for quote marks */

    if (c == '"' || c == '\'')
        delim = c;
    else if (c == '<')
    {
        start = lexer->lexsize;
        TY_(AddCharToLexer)(lexer, c);
        *pdelim = ParseServerInstruction( doc );
        len = lexer->lexsize - start;
        lexer->lexsize = start;
        return (len > 0 ? TY_(tmbstrndup)(doc->allocator,
                                          lexer->lexbuf+start, len) : NULL);
    }
    else
        TY_(UngetChar)(c, doc->docIn);

 /*
   and read the value string
   check for quote mark if needed
 */

    quotewarning = 0;
    start = lexer->lexsize;
    c = '\0';

    for (;;)
    {
        lastc = c;  /* track last character */
        c = TY_(ReadChar)(doc->docIn);

        if (c == EndOfStream)
        {
            TY_(ReportAttrError)( doc, lexer->token, NULL, UNEXPECTED_END_OF_FILE_ATTR );
            TY_(UngetChar)(c, doc->docIn);
            break;
        }

        if (delim == (tmbchar)0)
        {
            if (c == '>')
            {
                TY_(UngetChar)(c, doc->docIn);
                break;
            }

            if (c == '"' || c == '\'')
            {
                uint q = c;

                /* handle <input onclick=s("btn1")> and <a title=foo""">...</a> */
                /* this doesn't handle <a title=foo"/> which browsers treat as  */
                /* 'foo"/' nor  <a title=foo" /> which browser treat as 'foo"'  */
                
                c = TY_(ReadChar)(doc->docIn);
                if (c == '>')
                {
                    TY_(AddCharToLexer)(lexer, q);
                    TY_(UngetChar)(c, doc->docIn);
                    break;
                }
                else
                {
                    TY_(UngetChar)(c, doc->docIn);
                    c = q;
                }
            }

            if (c == '<')
            {
                TY_(UngetChar)(c, doc->docIn);
                c = '>';
                TY_(UngetChar)(c, doc->docIn);
                TY_(ReportAttrError)( doc, lexer->token, NULL, UNEXPECTED_GT );
                break;
            }

            /*
             For cases like <br clear=all/> need to avoid treating /> as
             part of the attribute value, however care is needed to avoid
             so treating <a href=http://www.acme.com/> in this way, which
             would map the <a> tag to <a href="http://www.acme.com"/>
            */
            if (c == '/')
            {
                /* peek ahead in case of /> */
                c = TY_(ReadChar)(doc->docIn);

                if ( c == '>' && !TY_(IsUrl)(doc, name) )
                {
                    *isempty = yes;
                    TY_(UngetChar)(c, doc->docIn);
                    break;
                }

                /* unget peeked character */
                TY_(UngetChar)(c, doc->docIn);
                c = '/';
            }
        }
        else  /* delim is '\'' or '"' */
        {
            if (c == delim)
                break;

            if (c == '\n' || c == '<' || c == '>')
                ++quotewarning;

            if (c == '>')
                seen_gt = yes;
        }

        if (c == '&')
        {
            TY_(AddCharToLexer)(lexer, c);
            ParseEntity( doc, IgnoreWhitespace );
            if (lexer->lexbuf[lexer->lexsize - 1] == '\n' && munge)
                ChangeChar(lexer, ' ');
            continue;
        }

        /*
         kludge for JavaScript attribute values
         with line continuations in string literals
        */
        if (c == '\\')
        {
            c = TY_(ReadChar)(doc->docIn);

            if (c != '\n')
            {
                TY_(UngetChar)(c, doc->docIn);
                c = '\\';
            }
        }

        if (TY_(IsWhite)(c))
        {
            if ( delim == 0 )
                break;

            if (munge)
            {
                /* discard line breaks in quoted URLs */ 
                /* #438650 - fix by Randy Waki */
                if ( c == '\n' && TY_(IsUrl)(doc, name) )
                {
                    /* warn that we discard this newline */
                    TY_(ReportAttrError)( doc, lexer->token, NULL, NEWLINE_IN_URI);
                    continue;
                }
                
                c = ' ';

                if (lastc == ' ')
                {
                    if (TY_(IsUrl)(doc, name) )
                        TY_(ReportAttrError)( doc, lexer->token, NULL, WHITE_IN_URI);
                    continue;
                }
            }
        }
        else if (foldCase && TY_(IsUpper)(c))
            c = TY_(ToLower)(c);

        TY_(AddCharToLexer)(lexer, c);
    }

    if (quotewarning > 10 && seen_gt && munge)
    {
        /*
           there is almost certainly a missing trailing quote mark
           as we have see too many newlines, < or > characters.

           an exception is made for Javascript attributes and the
           javascript URL scheme which may legitimately include < and >,
           and for attributes starting with "<xml " as generated by
           Microsoft Office.
        */
        if ( !TY_(IsScript)(doc, name) &&
             !(TY_(IsUrl)(doc, name) && TY_(tmbstrncmp)(lexer->lexbuf+start, "javascript:", 11) == 0) &&
             !(TY_(tmbstrncmp)(lexer->lexbuf+start, "<xml ", 5) == 0)
           )
            TY_(Report)( doc, NULL, NULL, SUSPECTED_MISSING_QUOTE ); 
    }

    len = lexer->lexsize - start;
    lexer->lexsize = start;


    if (len > 0 || delim)
    {
        /* ignore leading and trailing white space for all but title, alt, value */
        /* and prompts attributes unless --literal-attributes is set to yes      */
        /* #994841 - Whitespace is removed from value attributes                 */

        /* Issue #217 - Also only if/while (len > 0) - MUST NEVER GO NEGATIVE! */
        if ((len > 0) && munge &&
            TY_(tmbstrcasecmp)(name, "alt") &&
            TY_(tmbstrcasecmp)(name, "title") &&
            TY_(tmbstrcasecmp)(name, "value") &&
            TY_(tmbstrcasecmp)(name, "prompt"))
        {
            while (TY_(IsWhite)(lexer->lexbuf[start+len-1]) && (len > 0))
                --len;

            /* Issue #497 - Fix leading space trimming */
            while (TY_(IsWhite)(lexer->lexbuf[start]) && (len > 0))
            {
                ++start;
                --len;
            }
        }

        value = TY_(tmbstrndup)(doc->allocator, lexer->lexbuf + start, len);
    }
    else
        value = NULL;

    /* note delimiter if given */
    *pdelim = delim;

    return value;
}